

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::ReadOneScopeInfo
          (ByteCodeBufferReader *this,byte *current,ByteCodeCache *cache,ScopeInfo **scopeInfo)

{
  byte bVar1;
  PropertyId PVar2;
  code *pcVar3;
  ScopeInfo **ppSVar4;
  uint uVar5;
  bool bVar6;
  BOOL BVar7;
  byte *pbVar8;
  ScopeInfo *pSVar9;
  FunctionInfo *pFVar10;
  undefined4 *puVar11;
  Recycler *this_00;
  ScopeInfo *pSVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte *pbVar17;
  size_t size;
  int iVar18;
  ByteCodeBufferReader *this_01;
  long lVar19;
  long lVar20;
  undefined1 local_a0 [8];
  TrackAllocData data;
  LocalFunctionId relativeFunctionId;
  Type local_64;
  ScopeInfo *pSStack_60;
  int scopeType;
  ByteCodeBufferReader *local_58;
  byte *local_50;
  ByteCodeCache *local_48;
  ScopeInfo **local_40;
  uint local_38;
  byte local_32;
  bool local_31;
  int symbolCount;
  ScopeInfoFlags scopeInfoFlags;
  bool hasParent;
  
  local_38 = 0;
  local_40 = scopeInfo;
  pbVar8 = ReadInt32(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                     (int *)&local_38);
  data._36_4_ = 0;
  pSVar9 = (ScopeInfo *)
           ReadInt32(pbVar8,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar8)),
                     (int *)&data.field_0x24);
  local_48 = cache;
  pFVar10 = ByteCodeCache::LookupFunctionInfo(cache,this->scriptContext,data._36_4_);
  local_58 = this;
  if (pFVar10 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1182,"(functionInfo != nullptr)","functionInfo != nullptr");
    if (!bVar6) goto LAB_0087b6d7;
    *puVar11 = 0;
  }
  data.typeinfo = (type_info *)((long)(int)local_38 << 4);
  local_a0 = (undefined1  [8])&ScopeInfo::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_37bc28c;
  data.filename._0_4_ = 0x1184;
  pSStack_60 = pSVar9;
  this_00 = Memory::Recycler::TrackAllocInfo
                      (local_58->scriptContext->recycler,(TrackAllocData *)local_a0);
  lVar19 = (long)(int)local_38;
  BVar7 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar7 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar6) goto LAB_0087b6d7;
    *puVar11 = 0;
  }
  size = 0xffffffffffffffff;
  if ((ulong)(lVar19 * 0x10) < 0xffffffffffffffd0) {
    size = lVar19 * 0x10 + 0x30;
  }
  pSVar9 = (ScopeInfo *)
           Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                     (this_00,size);
  if (pSVar9 == (ScopeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar6) {
LAB_0087b6d7:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar11 = 0;
  }
  uVar5 = local_38;
  (pSVar9->parent).ptr = (ScopeInfo *)0x0;
  Memory::Recycler::WBSetBit((char *)&pSVar9->functionInfo);
  (pSVar9->functionInfo).ptr = pFVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar9->functionInfo);
  ppSVar4 = local_40;
  this_01 = local_58;
  *(ushort *)&pSVar9->field_0x10 = *(ushort *)&pSVar9->field_0x10 & 0xfe0f;
  pSVar9->scope = (Type)0x0;
  pSVar9->symbolCount = uVar5;
  *local_40 = pSVar9;
  pbVar8 = ReadByte((byte *)pSStack_60,
                    (size_t)(local_58->raw + ((long)local_58->totalSize - (long)pSStack_60)),
                    &local_32);
  bVar1 = local_32 * '\x02';
  *(ushort *)&(*ppSVar4)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar4)->field_0x10 & 0xfffe | local_32 & 1;
  *(ushort *)&(*ppSVar4)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar4)->field_0x10 & 0xfffd | local_32 & 2;
  *(ushort *)&(*ppSVar4)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar4)->field_0x10 & 0xfffb | local_32 & 4;
  *(ushort *)&(*ppSVar4)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar4)->field_0x10 & 0xfff7 | local_32 & 8;
  *(ushort *)&(*ppSVar4)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar4)->field_0x10 & 0xffdf | (ushort)(bVar1 & 0x20);
  *(ushort *)&(*ppSVar4)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar4)->field_0x10 & 0xffbf | (ushort)(bVar1 & 0x40);
  *(ushort *)&(*ppSVar4)->field_0x10 =
       (ushort)*(undefined4 *)&(*ppSVar4)->field_0x10 & 0xff7f | (ushort)(bVar1 & 0x80);
  *(ushort *)&(*ppSVar4)->field_0x10 = *(ushort *)&(*ppSVar4)->field_0x10 & 0xffef;
  pbVar8 = ReadInt32(pbVar8,(size_t)(this_01->raw + ((long)this_01->totalSize - (long)pbVar8)),
                     (int *)&local_64);
  pSVar9 = *ppSVar4;
  pSVar9->scopeType = local_64;
  pbVar8 = ReadInt32(pbVar8,(size_t)(this_01->raw + ((long)this_01->totalSize - (long)pbVar8)),
                     &pSVar9->scopeId);
  if (DAT_015d346a == '\x01') {
    Output::Trace(ByteCodeSerializationPhase,
                  L"Reading ScopeInfo. Flags: %u. Type: %d. ScopeId: %d. Symbol count: %d\n",
                  (ulong)local_32,(ulong)local_64,(ulong)(uint)(*local_40)->scopeId,(ulong)local_38)
    ;
  }
  if (0 < (int)local_38) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar19 = 0x39;
    lVar20 = 0;
    do {
      pSVar9 = *local_40;
      pbVar8 = ReadByte(pbVar8,(size_t)(this_01->raw + ((long)this_01->totalSize - (long)pbVar8)),
                        &local_31);
      bVar13 = local_31 & 1;
      pbVar17 = (byte *)((long)&(pSVar9->parent).ptr + lVar19);
      bVar1 = *pbVar17;
      *pbVar17 = bVar1 & 0xfe | bVar13;
      bVar14 = local_31 & 2;
      *pbVar17 = bVar1 & 0xfc | bVar13 | bVar14;
      bVar15 = local_31 & 4;
      *pbVar17 = bVar1 & 0xf8 | bVar13 | bVar14 | bVar15;
      bVar16 = local_31 & 8;
      *pbVar17 = bVar1 & 0xf0 | bVar13 | bVar14 | bVar15 | bVar16;
      *pbVar17 = bVar1 & 0xe0 | bVar13 | bVar14 | bVar15 | bVar16 | local_31 & 0x10U;
      *pbVar17 = bVar1 & 0xc0 | bVar13 | bVar14 | bVar15 | bVar16 | local_31 & 0x10U |
                 local_31 & 0x20U;
      pSStack_60 = pSVar9;
      pbVar8 = ReadByte(pbVar8,(size_t)(this_01->raw + ((long)this_01->totalSize - (long)pbVar8)),
                        pbVar17 + -1);
      pbVar8 = ReadInt32(pbVar8,(size_t)(this_01->raw + ((long)this_01->totalSize - (long)pbVar8)),
                         (int *)local_a0);
      iVar18 = local_a0._0_4_ - local_48->builtInPropertyCount;
      PVar2 = local_a0._0_4_;
      if (local_a0._0_4_ != -1 && local_48->builtInPropertyCount <= (int)local_a0._0_4_) {
        if (local_48->propertyCount <= iVar18) {
          AssertCount = AssertCount + 1;
          local_50 = pbVar8;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x99,"(realOffset<propertyCount)","realOffset<propertyCount")
          ;
          if (!bVar6) goto LAB_0087b6d7;
          *puVar11 = 0;
          pbVar8 = local_50;
        }
        if (local_48->propertyIds[iVar18] == -1) {
          AssertCount = AssertCount + 1;
          local_50 = pbVar8;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x9a,"(propertyIds[realOffset]!=-1)",
                                      "propertyIds[realOffset]!=-1");
          if (!bVar6) goto LAB_0087b6d7;
          *puVar11 = 0;
          pbVar8 = local_50;
        }
        PVar2 = local_48->propertyIds[iVar18];
      }
      *(PropertyId *)((long)pSStack_60 + lVar19 + -9) = PVar2;
      if (DAT_015d346a == '\x01') {
        Output::Trace(ByteCodeSerializationPhase,
                      L"\t\tSymbolInfo. Flags: %u. Type: %d. PropertyId: %u\n",(ulong)local_31,
                      (ulong)pbVar17[-1]);
      }
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 0x10;
      this_01 = local_58;
    } while (lVar20 < (int)local_38);
  }
  local_31 = false;
  pbVar8 = ReadBool(this_01,pbVar8,&local_31);
  if (local_31 != false) {
    pbVar8 = ReadInt32(pbVar8,(size_t)(this_01->raw + ((long)this_01->totalSize - (long)pbVar8)),
                       (int *)local_a0);
    pSVar12 = ByteCodeCache::LookupScopeInfo(local_48,this_01->scriptContext,local_a0._0_4_);
    pSVar9 = *local_40;
    Memory::Recycler::WBSetBit((char *)pSVar9);
    (pSVar9->parent).ptr = pSVar12;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar9);
  }
  return pbVar8;
}

Assistant:

const byte* ReadOneScopeInfo(const byte* current, ByteCodeCache* cache, ScopeInfo** scopeInfo)
    {
        int symbolCount = 0;
        current = ReadInt32(current, &symbolCount);

        Js::LocalFunctionId relativeFunctionId = 0;
        current = ReadUInt32(current, (uint*)&relativeFunctionId);
        FunctionInfo* functionInfo =  cache->LookupFunctionInfo(this->scriptContext, relativeFunctionId);

        Assert(functionInfo != nullptr);

        *scopeInfo = RecyclerNewPlusZ(scriptContext->GetRecycler(), symbolCount * sizeof(ScopeInfo::SymbolInfo), ScopeInfo, functionInfo, symbolCount);

        ScopeInfoFlags scopeInfoFlags;
        current = ReadByte(current, (byte*)&scopeInfoFlags);
        (*scopeInfo)->isDynamic = (scopeInfoFlags & sifIsDynamic) != 0;
        (*scopeInfo)->isObject = (scopeInfoFlags & sifIsObject) != 0;
        (*scopeInfo)->mustInstantiate = (scopeInfoFlags & sifMustInstantiate) != 0;
        (*scopeInfo)->isCached = (scopeInfoFlags & sifIsCached) != 0;
        (*scopeInfo)->hasLocalInClosure = (scopeInfoFlags & sifHasLocalInClosure) != 0;
        (*scopeInfo)->isGeneratorFunctionBody = (scopeInfoFlags & sifIsGeneratorFunctionBody) != 0;
        (*scopeInfo)->isAsyncFunctionBody = (scopeInfoFlags & sifIsAsyncFunctionBody) != 0;
        (*scopeInfo)->areNamesCached = false;

        int scopeType;
        current = ReadInt32(current, &scopeType);
        (*scopeInfo)->scopeType = (::ScopeType)scopeType;

        current = ReadInt32(current, &(*scopeInfo)->scopeId);

        OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("Reading ScopeInfo. Flags: %u. Type: %d. ScopeId: %d. Symbol count: %d\n"), scopeInfoFlags, scopeType, (*scopeInfo)->scopeId, symbolCount);

        for (int i = 0; i < symbolCount; i++)
        {
            ScopeInfo::SymbolInfo* sym = (*scopeInfo)->symbols + i;

            SymbolInfoFlags symbolInfoFlags;
            current = ReadByte(current, (byte*)&symbolInfoFlags);
            sym->hasFuncAssignment = (symbolInfoFlags & syifHasFuncAssignment) != 0;
            sym->isBlockVariable = (symbolInfoFlags & syifIsBlockVariable) != 0;
            sym->isConst = (symbolInfoFlags & syifIsConst) != 0;
            sym->isFuncExpr = (symbolInfoFlags & syifIsFuncExpr) != 0;
            sym->isModuleExportStorage = (symbolInfoFlags & syifIsModuleExportStorage) != 0;
            sym->isModuleImport = (symbolInfoFlags & syifIsModuleImport) != 0;

            current = ReadByte(current, (BYTE*)&sym->symbolType);

            PropertyId obscuredPropertyId;
            current = ReadInt32(current, (int*)&obscuredPropertyId);
            sym->propertyId = cache->LookupPropertyId(obscuredPropertyId);

            OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("\t\tSymbolInfo. Flags: %u. Type: %d. PropertyId: %u\n"), symbolInfoFlags, sym->symbolType, sym->propertyId);
        }

        bool hasParent = false;
        current = ReadBool(current, &hasParent);

        if (hasParent)
        {
            ScopeInfo* parent = nullptr;
            current = ReadScopeInfo(current, cache, &parent);
            (*scopeInfo)->parent = parent;
        }

        return current;
    }